

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-mongo.c
# Opt level: O0

int op_insert(lua_State *L)

{
  int iVar1;
  int off;
  uint32_t uVar2;
  char *pcVar3;
  lua_Integer lVar4;
  size_t sVar5;
  document doc_1;
  int i;
  int s;
  document doc;
  int total;
  int len;
  buffer buf;
  luaL_Buffer b;
  int dsz;
  char *name;
  size_t sz;
  lua_State *L_local;
  
  name = (char *)0x0;
  sz = (size_t)L;
  pcVar3 = luaL_checklstring(L,2,(size_t *)&name);
  iVar1 = document_length((lua_State *)sz);
  luaL_buffinit((lua_State *)sz,(luaL_Buffer *)(buf.buffer + 0x78));
  buffer_create((buffer *)&total);
  off = reserve_length((buffer *)&total);
  write_int32((buffer *)&total,0);
  write_int32((buffer *)&total,0);
  write_int32((buffer *)&total,0x7d2);
  lVar4 = lua_tointegerx((lua_State *)sz,1,(int *)0x0);
  write_int32((buffer *)&total,(int32_t)lVar4);
  write_string((buffer *)&total,pcVar3,(size_t)name);
  write_length((buffer *)&total,total + iVar1,off);
  luaL_addlstring((luaL_Buffer *)(buf.buffer + 0x78),(char *)buf._0_8_,(long)total);
  buffer_destroy((buffer *)&total);
  iVar1 = lua_isuserdata((lua_State *)sz,3);
  if (iVar1 == 0) {
    sVar5 = lua_rawlen((lua_State *)sz,3);
    for (doc_1._0_4_ = 1; (int)doc_1 <= (int)sVar5; doc_1._0_4_ = (int)doc_1 + 1) {
      lua_rawgeti((lua_State *)sz,3,(long)(int)doc_1);
      pcVar3 = (char *)lua_touserdata((lua_State *)sz,-1);
      lua_settop((lua_State *)sz,-2);
      uVar2 = get_length(pcVar3);
      luaL_addlstring((luaL_Buffer *)(buf.buffer + 0x78),pcVar3,(ulong)uVar2);
    }
  }
  else {
    pcVar3 = (char *)lua_touserdata((lua_State *)sz,3);
    uVar2 = get_length(pcVar3);
    luaL_addlstring((luaL_Buffer *)(buf.buffer + 0x78),pcVar3,(ulong)uVar2);
  }
  luaL_pushresult((luaL_Buffer *)(buf.buffer + 0x78));
  return 1;
}

Assistant:

static int
op_insert(lua_State *L) {
	size_t sz = 0;
	const char * name = luaL_checklstring(L,2,&sz);
	int dsz = document_length(L);

	luaL_Buffer b;
	luaL_buffinit(L, &b);

	struct buffer buf;
	buffer_create(&buf);
		// make package header, don't raise L error
		int len = reserve_length(&buf);
		write_int32(&buf, 0);
		write_int32(&buf, 0);
		write_int32(&buf, OP_INSERT);
		write_int32(&buf, lua_tointeger(L,1));
		write_string(&buf, name, sz);

		int total = buf.size + dsz;
		write_length(&buf, total, len);

		luaL_addlstring(&b, (const char *)buf.ptr, buf.size);
	buffer_destroy(&buf);
	
	if (lua_isuserdata(L,3)) {
		document doc = lua_touserdata(L,3);
		luaL_addlstring(&b, (const char *)doc, get_length(doc));
	} else {
		int s = lua_rawlen(L, 3);
		int i;
		for (i=1;i<=s;i++) {
			lua_rawgeti(L,3,i);
			document doc = lua_touserdata(L,-1);
			lua_pop(L,1);	// must call lua_pop before luaL_addlstring, because addlstring may change stack top
			luaL_addlstring(&b, (const char *)doc, get_length(doc));
		}
	}

	luaL_pushresult(&b);

	return 1;
}